

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall cmCTest::ExecuteTests(cmCTest *this)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var4;
  long *plVar5;
  int unaff_EBP;
  cmCTestGenericHandler **handler;
  _Alloc_hider _Var6;
  undefined1 auVar7 [16];
  long lVar8;
  initializer_list<cmCTestGenericHandler_*> __l;
  initializer_list<cmCTestGenericHandler_*> __l_00;
  string currDir;
  string workDir;
  ostringstream cmCTestLog_msg;
  string local_200;
  string local_1e0;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  cmCTestTestHandler *local_180;
  cmCTestUpdateHandler *pcStack_178;
  cmCTestConfigureHandler *local_170;
  cmCTestMemCheckHandler *pcStack_168;
  cmCTestSubmitHandler *local_160;
  cmCTestUploadHandler *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130 [16];
  
  _Var4._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if ((_Var4._M_head_impl)->RunConfigurationScript == true) {
    if ((_Var4._M_head_impl)->ExtraVerbose == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"* Extra verbosity turned on",0x1b);
      std::ios::widen((char)(ostringstream *)local_1a0 +
                      (char)*(_Base_ptr *)(local_1a0._0_8_ + -0x18));
      std::ostream::put((char)local_1a0);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xb37,local_200._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)local_130);
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    }
    local_1a0._0_8_ = &(_Var4._M_head_impl)->BuildHandler;
    local_1a0._8_8_ = &(_Var4._M_head_impl)->BuildAndTestHandler;
    local_190._M_allocated_capacity = (size_type)&(_Var4._M_head_impl)->CoverageHandler;
    local_190._8_8_ = &(_Var4._M_head_impl)->ScriptHandler;
    local_180 = &(_Var4._M_head_impl)->TestHandler;
    pcStack_178 = &(_Var4._M_head_impl)->UpdateHandler;
    local_170 = &(_Var4._M_head_impl)->ConfigureHandler;
    pcStack_168 = &(_Var4._M_head_impl)->MemCheckHandler;
    local_160 = &(_Var4._M_head_impl)->SubmitHandler;
    local_158 = &(_Var4._M_head_impl)->UploadHandler;
    __l._M_len = 10;
    __l._M_array = (iterator)local_1a0;
    std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::vector
              ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
               &local_200,__l,(allocator_type *)&local_1e0);
    if (local_200._M_dataplus._M_p != (pointer)local_200._M_string_length) {
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      bVar2 = (_Var4._M_head_impl)->ExtraVerbose;
      iVar3 = (_Var4._M_head_impl)->SubmitIndex;
      _Var6._M_p = local_200._M_dataplus._M_p;
      do {
        sVar1 = *(size_type *)_Var6._M_p;
        *(uint *)(sVar1 + 0x18) = (uint)bVar2;
        *(int *)(sVar1 + 0x118) = iVar3;
        _Var6._M_p = _Var6._M_p + 8;
      } while (_Var6._M_p != (pointer)local_200._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_200._M_dataplus._M_p,
                      local_200.field_2._M_allocated_capacity - (long)local_200._M_dataplus._M_p);
    }
    _Var4._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    *(uint *)((long)&(_Var4._M_head_impl)->ScriptHandler + 0x18) =
         (uint)(_Var4._M_head_impl)->Verbose;
    unaff_EBP = (**(code **)(*(long *)&((_Var4._M_head_impl)->ScriptHandler).
                                       super_cmCTestGenericHandler + 8))
                          (&(_Var4._M_head_impl)->ScriptHandler);
    if (unaff_EBP == 0) {
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"running script failing returning: ",0x22);
    plVar5 = (long *)std::ostream::operator<<(local_1a0,unaff_EBP);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0xb41,local_200._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)local_130);
  }
  else {
    (_Var4._M_head_impl)->ExtraVerbose = (_Var4._M_head_impl)->Verbose;
    (_Var4._M_head_impl)->Verbose = true;
    auVar7._8_4_ = (int)_Var4._M_head_impl;
    auVar7._0_8_ = _Var4._M_head_impl;
    auVar7._12_4_ = (int)((ulong)_Var4._M_head_impl >> 0x20);
    local_1a0._0_8_ = &(_Var4._M_head_impl)->BuildHandler;
    lVar8 = auVar7._8_8_;
    local_1a0._8_8_ = lVar8 + 0x4b0;
    local_190._M_allocated_capacity = (size_type)&(_Var4._M_head_impl)->CoverageHandler;
    local_190._8_8_ = lVar8 + 0x9f8;
    local_180 = &(_Var4._M_head_impl)->TestHandler;
    pcStack_178 = (cmCTestUpdateHandler *)(lVar8 + 0x15c8);
    local_170 = &(_Var4._M_head_impl)->ConfigureHandler;
    pcStack_168 = (cmCTestMemCheckHandler *)(lVar8 + 0x1830);
    local_160 = &(_Var4._M_head_impl)->SubmitHandler;
    local_158 = &(_Var4._M_head_impl)->UploadHandler;
    __l_00._M_len = 10;
    __l_00._M_array = (iterator)local_1a0;
    std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::vector
              ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
               &local_200,__l_00,(allocator_type *)&local_1e0);
    if (local_200._M_dataplus._M_p != (pointer)local_200._M_string_length) {
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      bVar2 = (_Var4._M_head_impl)->Verbose;
      iVar3 = (_Var4._M_head_impl)->SubmitIndex;
      _Var6._M_p = local_200._M_dataplus._M_p;
      do {
        sVar1 = *(size_type *)_Var6._M_p;
        *(uint *)(sVar1 + 0x18) = (uint)bVar2;
        *(int *)(sVar1 + 0x118) = iVar3;
        _Var6._M_p = _Var6._M_p + 8;
      } while (_Var6._M_p != (pointer)local_200._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_200._M_dataplus._M_p,
                      local_200.field_2._M_allocated_capacity - (long)local_200._M_dataplus._M_p);
    }
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,local_200._M_dataplus._M_p,
               local_200._M_string_length + local_200._M_dataplus._M_p);
    _Var4._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (*(size_type *)((long)&(_Var4._M_head_impl)->TestDir + 8) != 0) {
      cmsys::SystemTools::CollapseFullPath((string *)local_1a0,&(_Var4._M_head_impl)->TestDir);
      std::__cxx11::string::operator=((string *)&local_1e0,(string *)local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._0_8_ != &local_190) {
        operator_delete((void *)local_1a0._0_8_,(ulong)(local_190._M_allocated_capacity + 1));
      }
    }
    _Var6._M_p = local_1e0._M_dataplus._M_p;
    if (((local_200._M_string_length == local_1e0._M_string_length) &&
        (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_string_length ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0 ||
         (iVar3 = bcmp(local_200._M_dataplus._M_p,local_1e0._M_dataplus._M_p,
                       local_200._M_string_length), iVar3 == 0)))) ||
       (bVar2 = TryToChangeDirectory(this,&local_1e0), _Var6._M_p = local_1e0._M_dataplus._M_p,
       bVar2)) {
      iVar3 = Initialize(this,_Var6._M_p,(cmCTestStartCommand *)0x0);
      if (iVar3 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"Problem initializing the dashboard.",0x23);
        std::ios::widen((char)(ostream *)local_1a0 + (char)*(undefined8 *)(local_1a0._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_1a0);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0xb5d,(char *)local_1c0,false);
        if (local_1c0 != local_1b0) {
          operator_delete(local_1c0,local_1b0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
        std::ios_base::~ios_base((ios_base *)local_130);
        unaff_EBP = 0xc;
      }
      else {
        unaff_EBP = ProcessSteps(this);
      }
      _Var6._M_p = local_1e0._M_dataplus._M_p;
      if ((local_200._M_string_length != local_1e0._M_string_length) ||
         ((bVar2 = true,
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0 && (iVar3 = bcmp(local_200._M_dataplus._M_p,local_1e0._M_dataplus._M_p,
                                  local_200._M_string_length), iVar3 != 0)))) {
        cmsys::SystemTools::ChangeDirectory(&local_200);
        bVar2 = true;
        _Var6._M_p = local_1e0._M_dataplus._M_p;
      }
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != &local_1e0.field_2) {
      operator_delete(_Var6._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      return 1;
    }
    if (unaff_EBP == 0) {
      return 0;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Running a test(s) failed returning : ",0x25);
  plVar5 = (long *)std::ostream::operator<<(local_1a0,unaff_EBP);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0xb69,local_200._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)local_130);
  return unaff_EBP;
}

Assistant:

int cmCTest::ExecuteTests()
{
  int res;
  // call process directory
  if (this->Impl->RunConfigurationScript) {
    if (this->Impl->ExtraVerbose) {
      cmCTestLog(this, OUTPUT, "* Extra verbosity turned on" << std::endl);
    }
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      handler->SetVerbose(this->Impl->ExtraVerbose);
      handler->SetSubmitIndex(this->Impl->SubmitIndex);
    }
    this->GetScriptHandler()->SetVerbose(this->Impl->Verbose);
    res = this->GetScriptHandler()->ProcessHandler();
    if (res != 0) {
      cmCTestLog(this, DEBUG,
                 "running script failing returning: " << res << std::endl);
    }

  } else {
    // What is this?  -V seems to be the same as -VV,
    // and Verbose is always on in this case
    this->Impl->ExtraVerbose = this->Impl->Verbose;
    this->Impl->Verbose = true;
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      handler->SetVerbose(this->Impl->Verbose);
      handler->SetSubmitIndex(this->Impl->SubmitIndex);
    }

    const std::string currDir = cmSystemTools::GetCurrentWorkingDirectory();
    std::string workDir = currDir;
    if (!this->Impl->TestDir.empty()) {
      workDir = cmSystemTools::CollapseFullPath(this->Impl->TestDir);
    }

    if (currDir != workDir) {
      if (!this->TryToChangeDirectory(workDir)) {
        return 1;
      }
    }

    if (!this->Initialize(workDir.c_str(), nullptr)) {
      res = 12;
      cmCTestLog(this, ERROR_MESSAGE,
                 "Problem initializing the dashboard." << std::endl);
    } else {
      res = this->ProcessSteps();
    }
    this->Finalize();

    if (currDir != workDir) {
      cmSystemTools::ChangeDirectory(currDir);
    }
  }
  if (res != 0) {
    cmCTestLog(this, DEBUG,
               "Running a test(s) failed returning : " << res << std::endl);
  }
  return res;
}